

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_mapping_start_event_initialize
              (yaml_event_t *event,yaml_char_t *anchor,yaml_char_t *tag,int implicit,
              yaml_mapping_style_t style)

{
  int iVar1;
  size_t sVar2;
  yaml_tag_directive_t *local_58;
  yaml_char_t *tag_copy;
  yaml_char_t *anchor_copy;
  yaml_mark_t mark;
  yaml_mapping_style_t style_local;
  int implicit_local;
  yaml_char_t *tag_local;
  yaml_char_t *anchor_local;
  yaml_event_t *event_local;
  
  mark.column._0_4_ = style;
  mark.column._4_4_ = implicit;
  memset(&anchor_copy,0,0x18);
  tag_copy = (yaml_char_t *)0x0;
  local_58 = (yaml_tag_directive_t *)0x0;
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x3aa,
                  "int yaml_mapping_start_event_initialize(yaml_event_t *, yaml_char_t *, yaml_char_t *, int, yaml_mapping_style_t)"
                 );
  }
  if (anchor == (yaml_char_t *)0x0) {
LAB_001057dc:
    if (tag != (yaml_char_t *)0x0) {
      sVar2 = strlen((char *)tag);
      iVar1 = yaml_check_utf8(tag,sVar2);
      if ((iVar1 == 0) ||
         (local_58 = (yaml_tag_directive_t *)yaml_strdup(tag),
         local_58 == (yaml_tag_directive_t *)0x0)) goto LAB_001058ac;
    }
    memset(event,0,0x68);
    event->type = YAML_MAPPING_START_EVENT;
    (event->start_mark).index = (size_t)anchor_copy;
    (event->start_mark).line = mark.index;
    (event->start_mark).column = mark.line;
    (event->end_mark).index = (size_t)anchor_copy;
    (event->end_mark).line = mark.index;
    (event->end_mark).column = mark.line;
    (event->data).scalar.anchor = tag_copy;
    (event->data).document_start.tag_directives.start = local_58;
    (event->data).sequence_start.implicit = mark.column._4_4_;
    (event->data).sequence_start.style = (yaml_mapping_style_t)mark.column;
    event_local._4_4_ = 1;
  }
  else {
    sVar2 = strlen((char *)anchor);
    iVar1 = yaml_check_utf8(anchor,sVar2);
    if ((iVar1 != 0) && (tag_copy = yaml_strdup(anchor), tag_copy != (yaml_char_t *)0x0))
    goto LAB_001057dc;
LAB_001058ac:
    yaml_free(tag_copy);
    yaml_free((void *)0x0);
    event_local._4_4_ = 0;
  }
  return event_local._4_4_;
}

Assistant:

YAML_DECLARE(int)
yaml_mapping_start_event_initialize(yaml_event_t *event,
        yaml_char_t *anchor, yaml_char_t *tag, int implicit,
        yaml_mapping_style_t style)
{
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_char_t *anchor_copy = NULL;
    yaml_char_t *tag_copy = NULL;

    assert(event);      /* Non-NULL event object is expected. */

    if (anchor) {
        if (!yaml_check_utf8(anchor, strlen((char *)anchor))) goto error;
        anchor_copy = yaml_strdup(anchor);
        if (!anchor_copy) goto error;
    }

    if (tag) {
        if (!yaml_check_utf8(tag, strlen((char *)tag))) goto error;
        tag_copy = yaml_strdup(tag);
        if (!tag_copy) goto error;
    }

    MAPPING_START_EVENT_INIT(*event, anchor_copy, tag_copy,
            implicit, style, mark, mark);

    return 1;

error:
    yaml_free(anchor_copy);
    yaml_free(tag_copy);

    return 0;
}